

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

bool Js::InterpreterStackFrame::ShouldDoProfile(FunctionBody *executeFunction)

{
  ExecutionMode EVar1;
  bool bVar2;
  undefined1 local_13;
  undefined1 local_12;
  bool doProfile;
  FunctionBody *executeFunction_local;
  
  EVar1 = FunctionBody::GetInterpreterExecutionMode(executeFunction,false);
  local_12 = true;
  if (EVar1 != ProfilingInterpreter) {
    bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)executeFunction);
    local_13 = false;
    if (bVar2) {
      local_13 = DynamicProfileInfo::IsEnabled(executeFunction);
    }
    local_12 = local_13;
  }
  return local_12;
}

Assistant:

bool InterpreterStackFrame::ShouldDoProfile(FunctionBody* executeFunction)
    {
#if ENABLE_PROFILE_INFO
        const bool doProfile = executeFunction->GetInterpreterExecutionMode(false) == ExecutionMode::ProfilingInterpreter ||
            (executeFunction->IsInDebugMode() && DynamicProfileInfo::IsEnabled(executeFunction));
        return doProfile;
#else
        return false;
#endif
    }